

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O1

void __thiscall Manifold_DecomposeProps_Test::TestBody(Manifold_DecomposeProps_Test *this)

{
  Manifold *pMVar1;
  Manifold *manifold;
  Manifold *out;
  initializer_list<MeshSize> __l;
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  input;
  Manifold manifolds;
  vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> manifoldList;
  Manifold sphere;
  Manifold cube;
  Manifold tet;
  allocator_type local_1b9;
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  local_1b8;
  vector local_198 [16];
  vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> local_188;
  Manifold local_168 [16];
  Manifold local_158 [16];
  Manifold local_148 [16];
  vector<MeshSize,_std::allocator<MeshSize>_> local_138;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  Manifold *local_108;
  Manifold *pMStack_100;
  pointer local_f8;
  pointer pfStack_f0;
  pointer local_e8;
  pointer puStack_e0;
  
  local_1b8.
  super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::manifold::Manifold::Tetrahedron();
  WithPositionColors(local_148);
  ::manifold::Manifold::~Manifold((Manifold *)&local_108);
  std::vector<manifold::Manifold,std::allocator<manifold::Manifold>>::
  emplace_back<manifold::Manifold&>
            ((vector<manifold::Manifold,std::allocator<manifold::Manifold>> *)&local_188,local_148);
  ::manifold::Manifold::GetMeshGL((int)&local_108);
  std::
  vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
  ::emplace_back<manifold::MeshGLP<float,unsigned_int>>
            ((vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
              *)&local_1b8,(MeshGLP<float,_unsigned_int> *)&local_108);
  ::manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)&local_108);
  local_120 = 0x3ff0000000000000;
  uStack_118 = 0x3ff0000000000000;
  local_110 = 0x3ff0000000000000;
  ::manifold::Manifold::Cube(&local_108,0);
  WithPositionColors(local_158);
  ::manifold::Manifold::~Manifold((Manifold *)&local_108);
  std::vector<manifold::Manifold,std::allocator<manifold::Manifold>>::
  emplace_back<manifold::Manifold&>
            ((vector<manifold::Manifold,std::allocator<manifold::Manifold>> *)&local_188,local_158);
  ::manifold::Manifold::GetMeshGL((int)&local_108);
  std::
  vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
  ::emplace_back<manifold::MeshGLP<float,unsigned_int>>
            ((vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
              *)&local_1b8,(MeshGLP<float,_unsigned_int> *)&local_108);
  ::manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)&local_108);
  ::manifold::Manifold::Sphere(1.0,(int)&local_108);
  WithPositionColors(local_168);
  ::manifold::Manifold::~Manifold((Manifold *)&local_108);
  std::vector<manifold::Manifold,std::allocator<manifold::Manifold>>::
  emplace_back<manifold::Manifold&>
            ((vector<manifold::Manifold,std::allocator<manifold::Manifold>> *)&local_188,local_168);
  ::manifold::Manifold::GetMeshGL((int)&local_108);
  std::
  vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
  ::emplace_back<manifold::MeshGLP<float,unsigned_int>>
            ((vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
              *)&local_1b8,(MeshGLP<float,_unsigned_int> *)&local_108);
  ::manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)&local_108);
  ::manifold::Manifold::Compose(local_198);
  local_e8 = (pointer)0x400000004;
  puStack_e0 = (pointer)0x400000003;
  local_f8 = (pointer)0x800000006;
  pfStack_f0 = (pointer)0x600000003;
  local_108 = (Manifold *)0xc00000008;
  pMStack_100 = (Manifold *)0x800000003;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_108;
  std::vector<MeshSize,_std::allocator<MeshSize>_>::vector(&local_138,__l,&local_1b9);
  ExpectMeshes((Manifold *)local_198,&local_138);
  if (local_138.super__Vector_base<MeshSize,_std::allocator<MeshSize>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<MeshSize,_std::allocator<MeshSize>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<MeshSize,_std::allocator<MeshSize>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<MeshSize,_std::allocator<MeshSize>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  RelatedGL((Manifold *)local_198,&local_1b8,false,false);
  ::manifold::Manifold::Decompose();
  pMVar1 = pMStack_100;
  if (local_108 != pMStack_100) {
    out = local_108;
    do {
      RelatedGL(out,&local_1b8,false,false);
      out = out + 0x10;
    } while (out != pMVar1);
  }
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector
            ((vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> *)&local_108);
  ::manifold::Manifold::~Manifold((Manifold *)local_198);
  ::manifold::Manifold::~Manifold(local_168);
  ::manifold::Manifold::~Manifold(local_158);
  ::manifold::Manifold::~Manifold(local_148);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector(&local_188);
  std::
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ::~vector(&local_1b8);
  return;
}

Assistant:

TEST(Manifold, ValidInput) {
  MeshGL tetGL = TetGL();
  Manifold tet(tetGL);
  EXPECT_FALSE(tet.IsEmpty());
  EXPECT_EQ(tet.Status(), Manifold::Error::NoError);
}